

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,__1,__1,_0,__1,__1> *lhs,
               Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               Scalar *alpha)

{
  float fVar1;
  Index IVar2;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,1,_1,false>> *this;
  Scalar *pSVar3;
  ReturnType RVar4;
  undefined1 local_c8 [8];
  RhsNested actual_rhs;
  LhsNested actual_lhs;
  ConstRowXpr local_60;
  float *local_28;
  Scalar *alpha_local;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *rhs_local;
  Matrix<float,__1,__1,_0,__1,__1> *lhs_local;
  Matrix<float,__1,_1,_0,__1,_1> *dst_local;
  
  local_28 = alpha;
  alpha_local = (Scalar *)rhs;
  rhs_local = (Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)lhs;
  lhs_local = (Matrix<float,__1,__1,_0,__1,__1> *)dst;
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  if ((IVar2 == 1) &&
     (IVar2 = MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      *)alpha_local), IVar2 == 1)) {
    fVar1 = *local_28;
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_60,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)rhs_local,0);
    this = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,1,_1,false>> *)
           DenseBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           conjugate((DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)&local_60);
    DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::col
              ((ConstColXpr *)&actual_lhs,
               (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)alpha_local,0);
    RVar4 = MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,1,-1,false>>::
            dot<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>>
                      (this,(MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                             *)&actual_lhs);
    pSVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeffRef
                       ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)lhs_local,0,0);
    *pSVar3 = fVar1 * RVar4 + *pSVar3;
    return;
  }
  actual_rhs._16_8_ = rhs_local;
  Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_c8,
             (Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)alpha_local);
  gemv_dense_selector<2,0,true>::
  run<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<float,_1,1,0,_1,1>>
            ((Matrix<float,__1,__1,_0,__1,__1> *)actual_rhs._16_8_,
             (Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_c8,
             (Matrix<float,__1,_1,_0,__1,_1> *)lhs_local,local_28);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }